

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetAccessors
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,Var getter,Var setter,PropertyOperationFlags flags)

{
  Type *pTVar1;
  Type *pTVar2;
  ScriptContext *pSVar3;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  code *pcVar5;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar6;
  PropertyRecord *pPVar7;
  DictionaryPropertyDescriptor<unsigned_short> DVar8;
  bool bVar9;
  byte bVar10;
  Flags FVar11;
  unsigned_short uVar12;
  int iVar13;
  BOOL BVar14;
  uint32 uVar15;
  PropertyId PVar16;
  undefined4 *puVar17;
  BigDictionaryTypeHandler *this_00;
  JavascriptFunction *pJVar18;
  JavascriptFunction *pJVar19;
  Var pvVar20;
  char *message;
  byte bVar21;
  char *error;
  uint lineNumber;
  byte bVar22;
  JavascriptLibrary *pJVar23;
  Type *pTVar24;
  Type *nextPropertyIndex;
  DynamicObject *pDVar25;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_90;
  Type *local_88;
  ScriptContext *local_80;
  PropertyRecord *local_78;
  PropertyRecord *propertyRecord;
  JavascriptFunction *local_68;
  JavascriptLibrary *local_60;
  PropertyOperationFlags local_54;
  JavascriptFunction *local_50;
  DictionaryPropertyDescriptor<unsigned_short> local_48;
  DictionaryPropertyDescriptor<unsigned_short> newDescriptor;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  local_68 = (JavascriptFunction *)getter;
  local_54 = flags;
  local_50 = (JavascriptFunction *)setter;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x653,"(instance)","instance");
    if (!bVar9) goto LAB_00da9014;
    *puVar17 = 0;
  }
  pJVar23 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar3 = (pJVar23->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar9 = DynamicTypeHandler::VerifyIsExtensible(&this->super_DynamicTypeHandler,pSVar3,false);
  local_60 = pJVar23;
  if (((!bVar9) &&
      (iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x11])
                          (this,instance,(ulong)(uint)propertyId,0,0), iVar13 == 0)) &&
     (bVar9 = JavascriptFunction::IsBuiltinProperty(instance,(PropertyIds)propertyId), !bVar9)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x658,
                                "(this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId) || JavascriptFunction::IsBuiltinProperty(instance, propertyId))"
                                ,
                                "this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId) || JavascriptFunction::IsBuiltinProperty(instance, propertyId)"
                               );
    if (!bVar9) goto LAB_00da9014;
    *puVar17 = 0;
    pJVar23 = local_60;
  }
  iVar13 = (this->super_DynamicTypeHandler).slotCapacity;
  if (iVar13 + -2 < (int)(uint)this->nextPropertyIndex) {
    if (0xfffc < iVar13) {
      this_00 = ConvertToBigDictionaryTypeHandler(this,instance);
      BVar14 = DictionaryTypeHandlerBase<int>::SetAccessors
                         (this_00,instance,propertyId,local_68,local_50,local_54);
      return BVar14;
    }
    EnsureSlotCapacity(this,instance,2);
  }
  if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
    ScriptContext::InvalidateProtoCaches(pSVar3,propertyId);
  }
  if ((local_68 == (JavascriptFunction *)0x0) ||
     ((pJVar23->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == local_68)) {
    propertyRecord._4_4_ = (undefined4)CONCAT71((int7)((ulong)local_68 >> 8),1);
  }
  else {
    propertyRecord._4_4_ = 0;
  }
  if ((local_50 == (JavascriptFunction *)0x0) ||
     ((pJVar23->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == local_50)) {
    bVar22 = 1;
  }
  else {
    bVar22 = 0;
  }
  local_80 = pSVar3;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x677,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar9) goto LAB_00da9014;
    *puVar17 = 0;
  }
  nextPropertyIndex = &this->nextPropertyIndex;
  local_78 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar9 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_78,
                     (DictionaryPropertyDescriptor<unsigned_short> **)&newDescriptor,
                     (int *)&local_48);
  pJVar23 = local_60;
  if (bVar9) {
    if (((*(byte *)newDescriptor & 0x60) != 0) &&
       (((*(byte *)((long)newDescriptor + 1) & 8) != 0 ||
        (((*(short *)((long)newDescriptor + 2) == -1 && (*(short *)((long)newDescriptor + 4) == -1))
         && (*(short *)((long)newDescriptor + 6) == -1)))))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x67c,"(descriptor->SanityCheckFixedBits())",
                                  "descriptor->SanityCheckFixedBits()");
      if (!bVar9) goto LAB_00da9014;
      *puVar17 = 0;
    }
    pJVar23 = local_60;
    bVar10 = *(byte *)((long)newDescriptor + 1);
    if ((bVar10 & 8) != 0) {
      bVar21 = 7;
      if ((bVar10 & 0x10) != 0) {
        bVar21 = bVar10 & 0xd0 | 7;
      }
      *(byte *)((long)newDescriptor + 1) = bVar21;
    }
    if ((*(byte *)newDescriptor & 4) == 0) {
      local_88 = nextPropertyIndex;
      local_68 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_68,local_60);
      nextPropertyIndex = local_88;
      local_50 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_50,pJVar23);
    }
    bVar9 = DictionaryPropertyDescriptor<unsigned_short>::ConvertToGetterSetter
                      ((DictionaryPropertyDescriptor<unsigned_short> *)newDescriptor,
                       nextPropertyIndex);
    if ((bVar9) &&
       ((this->super_DynamicTypeHandler).slotCapacity < (int)(uint)this->nextPropertyIndex)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x694,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar9) goto LAB_00da9014;
      *puVar17 = 0;
    }
    if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x698,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
      if (!bVar9) goto LAB_00da9014;
      *puVar17 = 0;
    }
    pRVar4 = (this->singletonInstance).ptr;
    if (pRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pDVar25 = (DynamicObject *)0x0;
    }
    else {
      pDVar25 = (DynamicObject *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef;
    }
    if (pDVar25 != instance && pRVar4 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x69b,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar9) goto LAB_00da9014;
      *puVar17 = 0;
    }
    bVar10 = *(byte *)newDescriptor;
    if ((bVar10 & 8) == 0) {
      *(byte *)newDescriptor = bVar10 | 8;
      if (0xf < (uint)propertyId && pDVar25 == instance) {
        BVar14 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (((local_54 & PropertyOperation_NonFixedValue) == PropertyOperation_None) &&
           (BVar14 != 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x6a5,
                                      "(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0)"
                                      ,
                                      "!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0"
                                     );
          if (!bVar9) goto LAB_00da9014;
          *puVar17 = 0;
        }
        DVar8 = newDescriptor;
        if ((local_54 & PropertyOperation_NonFixedValue) == PropertyOperation_None) {
          bVar9 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixAccessorPropsPhase);
          bVar10 = !bVar9 << 5;
        }
        else {
          bVar10 = 0;
        }
        *(byte *)DVar8 = *(byte *)DVar8 & 0xdf | bVar10;
      }
      if ((byte)((byte)propertyRecord._4_4_ | bVar22) == 1) {
        *(byte *)newDescriptor = *(byte *)newDescriptor | 0x10;
      }
    }
    else {
      if ((bVar10 & 0x10) != 0) {
        uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                           ((DictionaryPropertyDescriptor<unsigned_short> *)newDescriptor);
        pJVar18 = (JavascriptFunction *)
                  DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,(uint)uVar12)
        ;
        uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                           ((DictionaryPropertyDescriptor<unsigned_short> *)newDescriptor);
        pJVar19 = (JavascriptFunction *)
                  DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,(uint)uVar12)
        ;
        if ((((~(byte)propertyRecord._4_4_ & local_68 != pJVar18) == 0) &&
            (pJVar19 == (local_60->super_JavascriptLibraryBase).defaultAccessorFunction.ptr)) ||
           (((~bVar22 & local_50 != pJVar19) == 0 &&
            (pJVar18 == (local_60->super_JavascriptLibraryBase).defaultAccessorFunction.ptr)))) {
          *(byte *)newDescriptor = *(byte *)newDescriptor & 0xef;
          goto LAB_00da8e60;
        }
      }
      InvalidateFixedField<int>
                (this,instance,propertyId,
                 (DictionaryPropertyDescriptor<unsigned_short> *)newDescriptor);
    }
LAB_00da8e60:
    if (local_68 != (JavascriptFunction *)0x0) {
      pvVar20 = DynamicTypeHandler::CanonicalizeAccessor(local_68,local_60);
      uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                         ((DictionaryPropertyDescriptor<unsigned_short> *)newDescriptor);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar12,pvVar20);
    }
    pJVar23 = local_60;
    if (local_50 != (JavascriptFunction *)0x0) {
      pvVar20 = DynamicTypeHandler::CanonicalizeAccessor(local_50,local_60);
      uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                         ((DictionaryPropertyDescriptor<unsigned_short> *)newDescriptor);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar12,pvVar20);
    }
    DynamicObject::ChangeType(instance);
    Memory::Recycler::WBSetBit((char *)&local_48);
    local_48 = (DictionaryPropertyDescriptor<unsigned_short>)
               &pJVar23->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
    DVar8 = local_48;
    pPVar7 = local_78;
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
    pSVar3 = local_80;
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      PVar16 = DynamicTypeHandler::TMapKey_GetPropertyId(local_80,pPVar7);
      ScriptContext::InvalidateStoreFieldCaches(pSVar3,PVar16);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)DVar8);
    }
    pTVar24 = &local_60->typesWithNoSpecialPropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_48);
    local_48 = (DictionaryPropertyDescriptor<unsigned_short>)pTVar24;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
    DVar8 = local_48;
    bVar9 = NoSpecialPropertyCache::IsSpecialProperty(local_78);
    if ((bVar9) &&
       (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
       ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
                ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)DVar8);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,(Var)0x0,SideEffects_Any);
    uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                       ((DictionaryPropertyDescriptor<unsigned_short> *)newDescriptor);
    pvVar20 = DynamicObject::GetSlot(instance,(uint)uVar12);
    if (pvVar20 != (Var)0x0) {
      uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                         ((DictionaryPropertyDescriptor<unsigned_short> *)newDescriptor);
      pvVar20 = DynamicObject::GetSlot(instance,(uint)uVar12);
      if (pvVar20 != (Var)0x0) {
        return 1;
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    error = 
    "(instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr)"
    ;
    message = 
    "instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr"
    ;
    lineNumber = 0x6d5;
  }
  else {
    if (local_78->isNumeric == true) {
      uVar15 = PropertyRecord::GetNumericValue(local_78);
      iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x30])
                         (this,instance,(ulong)uVar15,local_68,local_50);
      return iVar13;
    }
    local_68 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_68,local_60);
    pJVar18 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_50,pJVar23);
    local_48.Getter = *nextPropertyIndex;
    if (local_48.Getter == 0xffff) {
LAB_00da9016:
      ::Math::DefaultOverflowPolicy();
    }
    local_48.Setter = local_48.Getter + 1;
    *nextPropertyIndex = local_48.Setter;
    if (local_48.Setter == 0xffff) goto LAB_00da9016;
    this->nextPropertyIndex = local_48.Getter + 2;
    local_48.flags = IsAccessor|PreventFalseReference;
    local_48.Attributes = '\a';
    local_48.Data = 0xffff;
    if ((this->super_DynamicTypeHandler).slotCapacity < (int)(uint)(ushort)(local_48.Getter + 2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6e6,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar9) goto LAB_00da9014;
      *puVar17 = 0;
    }
    if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6e9,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
      if (!bVar9) goto LAB_00da9014;
      *puVar17 = 0;
    }
    pRVar4 = (this->singletonInstance).ptr;
    if (pRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pDVar25 = (DynamicObject *)0x0;
    }
    else {
      pDVar25 = (DynamicObject *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef;
    }
    local_50 = pJVar18;
    if (pDVar25 != instance && pRVar4 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6ec,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar9) goto LAB_00da9014;
      *puVar17 = 0;
    }
    local_48 = (DictionaryPropertyDescriptor<unsigned_short>)((ulong)local_48 | 8);
    if (0xf < (uint)propertyId && pDVar25 == instance) {
      BVar14 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (((local_54 & PropertyOperation_NonFixedValue) == PropertyOperation_None) && (BVar14 != 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x6f1,
                                    "(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0)"
                                    ,
                                    "!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0"
                                   );
        if (!bVar9) goto LAB_00da9014;
        *puVar17 = 0;
      }
      if ((local_54 & PropertyOperation_NonFixedValue) == PropertyOperation_None) {
        bVar9 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixAccessorPropsPhase);
        FVar11 = !bVar9 << 5;
      }
      else {
        FVar11 = None;
      }
      FVar11 = local_48.flags & ~IsFixed | FVar11;
      local_48.flags = FVar11;
      if ((byte)((byte)propertyRecord._4_4_ | bVar22) == 1) {
        local_48 = (DictionaryPropertyDescriptor<unsigned_short>)
                   (CONCAT71(local_48._1_7_,FVar11) | 0x10);
      }
    }
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)(this->propertyMap).ptr,&local_78,&local_48);
    uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(&local_48);
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar12,local_68);
    uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(&local_48);
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar12,local_50);
    pTVar2 = &local_60->typesWithOnlyWritablePropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_90);
    local_90 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)pTVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_90);
    pPVar7 = local_78;
    pPVar6 = local_90;
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
    pSVar3 = local_80;
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      PVar16 = DynamicTypeHandler::TMapKey_GetPropertyId(local_80,pPVar7);
      ScriptContext::InvalidateStoreFieldCaches(pSVar3,PVar16);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar6);
    }
    pTVar24 = &local_60->typesWithNoSpecialPropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_90);
    local_90 = pTVar24;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_90);
    pPVar6 = local_90;
    bVar9 = NoSpecialPropertyCache::IsSpecialProperty(local_78);
    if ((bVar9) &&
       (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
       ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar6);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,(Var)0x0,SideEffects_Any);
    uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(&local_48);
    pvVar20 = DynamicObject::GetSlot(instance,(uint)uVar12);
    if (pvVar20 != (Var)0x0) {
      uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(&local_48);
      pvVar20 = DynamicObject::GetSlot(instance,(uint)uVar12);
      if (pvVar20 != (Var)0x0) {
        return 1;
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    error = 
    "(instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr)"
    ;
    message = 
    "instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr"
    ;
    lineNumber = 0x708;
  }
  bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                              ,lineNumber,error,message);
  if (bVar9) {
    *puVar17 = 0;
    return 1;
  }
LAB_00da9014:
  pcVar5 = (code *)invalidInstructionException();
  (*pcVar5)();
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetAccessors(DynamicObject* instance, PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        Assert(instance);
        JavascriptLibrary* library = instance->GetLibrary();
        ScriptContext* scriptContext = instance->GetScriptContext();

        Assert(this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId)
            || JavascriptFunction::IsBuiltinProperty(instance, propertyId));

        // We could potentially need 2 new slots to hold getter/setter, try pre-reserve
        if (this->GetSlotCapacity() - 2 < nextPropertyIndex)
        {
            if (this->GetSlotCapacity() > MaxPropertyIndexSize - 2)
            {
                return ConvertToBigDictionaryTypeHandler(instance)
                    ->SetAccessors(instance, propertyId, getter, setter, flags);
            }

            this->EnsureSlotCapacity(instance, 2);
        }

        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->GetFlags() & IsPrototypeFlag)
        {
            scriptContext->InvalidateProtoCaches(propertyId);
        }

        bool isGetterSet = true;
        bool isSetterSet = true;
        if (!getter || getter == library->GetDefaultAccessorFunction())
        {
            isGetterSet = false;
        }
        if (!setter || setter == library->GetDefaultAccessorFunction())
        {
            isSetterSet = false;
        }

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults;
                }
            }

            if (!descriptor->GetIsAccessor())
            {
                // New getter/setter, make sure both values are not null and set to the slots
                getter = CanonicalizeAccessor(getter, library);
                setter = CanonicalizeAccessor(setter, library);
            }

            // conversion from data-property to accessor property
            if (descriptor->ConvertToGetterSetter(nextPropertyIndex))
            {
                AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved 2 at entry
            }

            // DictionaryTypeHandlers are not supposed to be shared.
            Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

            // Although we don't actually have CreateTypeForNewScObject on DictionaryTypeHandler, we could potentially
            // transition to a DictionaryTypeHandler with some properties uninitialized.
            if (!descriptor->GetIsInitialized())
            {
                descriptor->SetIsInitialized(true);
                if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId))
                {
                    // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                    Assert(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0);
                    descriptor->SetIsFixed((flags & PropertyOperation_NonFixedValue) == 0 && ShouldFixAccessorProperties());
                }
                if (!isGetterSet || !isSetterSet)
                {
                    descriptor->SetIsOnlyOneAccessorInitialized(true);
                }
            }
            else if (descriptor->GetIsOnlyOneAccessorInitialized())
            {
                // Only one of getter/setter was initialized, allow the isFixed to stay if we are defining the other one.
                Var oldGetter = GetSlot(instance, descriptor->GetGetterPropertyIndex());
                Var oldSetter = GetSlot(instance, descriptor->GetSetterPropertyIndex());

                if (((getter == oldGetter || !isGetterSet) && oldSetter == library->GetDefaultAccessorFunction()) ||
                    ((setter == oldSetter || !isSetterSet) && oldGetter == library->GetDefaultAccessorFunction()))
                {
                    descriptor->SetIsOnlyOneAccessorInitialized(false);
                }
                else
                {
                    InvalidateFixedField(instance, propertyId, descriptor);
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif

            // don't overwrite an existing accessor with null
            if (getter != nullptr)
            {
                getter = CanonicalizeAccessor(getter, library);
                SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), getter);
            }
            if (setter != nullptr)
            {
                setter = CanonicalizeAccessor(setter, library);
                SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), setter);
            }
            instance->ChangeType();
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);
            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);

            // Let's make sure we always have a getter and a setter
            Assert(instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr);

            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItemAccessors(instance, propertyRecord->GetNumericValue(), getter, setter);
        }

        getter = CanonicalizeAccessor(getter, library);
        setter = CanonicalizeAccessor(setter, library);
        T getterIndex = ::Math::PostInc(nextPropertyIndex);
        T setterIndex = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(getterIndex, setterIndex);
        AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved 2 at entry

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
        newDescriptor.SetIsInitialized(true);
        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId))
        {
            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
            Assert(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0);

            // Even if one (or both?) accessors are the default functions obtained through canonicalization,
            // they are still legitimate functions, so it's ok to mark the whole property as fixed.
            newDescriptor.SetIsFixed((flags & PropertyOperation_NonFixedValue) == 0 && ShouldFixAccessorProperties());
            if (!isGetterSet || !isSetterSet)
            {
                newDescriptor.SetIsOnlyOneAccessorInitialized(true);
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        SetSlotUnchecked(instance, newDescriptor.GetGetterPropertyIndex(), getter);
        SetSlotUnchecked(instance, newDescriptor.GetSetterPropertyIndex(), setter);

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);

        SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);

        // Let's make sure we always have a getter and a setter
        Assert(instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr);

        return true;
    }